

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O1

void different_stl_string_references_are_not_equal(void)

{
  Constraint_ *pCVar1;
  string alice;
  string bob;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"bob","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"alice","");
  pCVar1 = (Constraint_ *)cgreen::create_not_equal_to_string_constraint((string *)local_58,"alice");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x76,"bob",(string *)local_38,pCVar1);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return;
}

Assistant:

TestSuite* cpp_assertion_tests() {
    TestSuite *suite = create_test_suite();
    set_setup(suite, setup);
    set_teardown(suite, teardown);
    add_test(suite, custom_large_classes_are_equal);
    add_test(suite, custom_large_classes_are_not_equal);
    add_test(suite, same_stl_string_references_are_equal);
    add_test(suite, stl_string_contains_string);
    add_test(suite, string_contains_stl_string);
    add_test(suite, string_contains_stl_string_pointer);
    add_test(suite, stl_string_does_not_contain_string);
    add_test(suite, string_does_not_contain_stl_string);
    add_test(suite, string_does_not_contain_stl_string_pointer);
    add_test(suite, stl_string_begins_with_string);
    add_test(suite, string_begins_with_stl_string);
    add_test(suite, string_begins_with_stl_string_pointer);
    add_test(suite, different_stl_string_references_are_not_equal);
    add_test(suite, different_stl_string_pointers_are_not_equal);
    add_test(suite, different_stl_string_pointer_and_reference_are_not_equal);
    add_test(suite, different_stl_string_reference_and_pointer_are_not_equal);
    add_test(suite, same_stl_string_pointer_and_reference_are_equal);
    add_test(suite, same_stl_string_reference_and_pointer_are_equal);
    add_test(suite, stl_string_pointer_is_not_null);
    add_test(suite, stl_string_pointer_is_null);
    add_test(suite, stl_string_length_assertion_failure_is_readable);
    add_test(suite, std_exception_what_is_output);
    add_test(suite, assert_throws_macro_passes_basic_type);
    add_test(suite, assert_throws_macro_passes_pointer_type);
    return suite;
}